

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O3

void anim_full(Sprite *spr,float *lval,float start_val,float end_val,Interp func,float delay,
              float duration)

{
  float fVar1;
  double dVar2;
  long lVar3;
  undefined8 *puVar4;
  float fVar5;
  float fVar6;
  
  dVar2 = (double)al_get_time();
  fVar5 = (float)((double)delay + dVar2);
  lVar3 = 0x48;
  do {
    if (*(float **)((long)spr->anims + lVar3 + -0x48) == lval) {
      fVar6 = *(float *)((long)spr->anims + lVar3 + -0x30);
      if (fVar5 < fVar6) {
        *(float *)((long)spr->anims + lVar3 + -0x30) = fVar5;
        *(float *)((long)spr->anims + lVar3 + -0x3c) = start_val;
        fVar6 = fVar5;
      }
      fVar1 = *(float *)((long)spr->anims + lVar3 + -0x34);
      if ((fVar5 <= fVar1) || (fVar6 <= fVar1)) {
        *(undefined8 *)((long)spr->anims + lVar3 + -0x48) = 0;
      }
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x188);
  lVar3 = 0x30;
  puVar4 = &get_next_anim_dummy_anim;
  do {
    if (*(long *)((long)spr->anims + lVar3 + -0x30) == 0) {
      puVar4 = (undefined8 *)((long)spr->anims + lVar3 + -0x30);
      break;
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x170);
  *puVar4 = lval;
  *(float *)(puVar4 + 1) = start_val;
  *(float *)((long)puVar4 + 0xc) = end_val;
  *(Interp *)(puVar4 + 2) = func;
  *(float *)((long)puVar4 + 0x14) = fVar5;
  *(float *)(puVar4 + 3) = duration + fVar5;
  return;
}

Assistant:

static void anim_full(Sprite *spr, float *lval, float start_val, float end_val,
   Interp func, float delay, float duration)
{
   float start_time;
   Anim *anim;

   start_time = al_get_time() + delay;
   fix_conflicting_anims(spr, lval, start_time, start_val);

   anim = get_next_anim(spr);
   anim->lval = lval;
   anim->start_val = start_val;
   anim->end_val = end_val;
   anim->func = func;
   anim->start_time = start_time;
   anim->end_time = start_time + duration;
}